

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

bool __thiscall cfd::core::ByteData256::Equals(ByteData256 *this,ByteData256 *bytedata)

{
  bool bVar1;
  ByteData256 *bytedata_local;
  ByteData256 *this_local;
  
  bVar1 = ::std::operator==(&this->data_,&bytedata->data_);
  return bVar1;
}

Assistant:

bool ByteData256::Equals(const ByteData256& bytedata) const {
  if (data_ == bytedata.data_) {
    return true;
  }
  return false;
}